

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

void __thiscall
fmt::v9::basic_format_specs<char>::basic_format_specs(basic_format_specs<char> *this)

{
  this->width = 0;
  this->precision = -1;
  this->type = none;
  *(ushort *)&this->field_0x9 = *(ushort *)&this->field_0x9 & 0xfe00;
  (this->fill).data_[0] = ' ';
  (this->fill).data_[1] = '\0';
  (this->fill).data_[2] = '\0';
  (this->fill).data_[3] = '\0';
  (this->fill).size_ = '\x01';
  return;
}

Assistant:

constexpr basic_format_specs()
      : width(0),
        precision(-1),
        type(presentation_type::none),
        align(align::none),
        sign(sign::none),
        alt(false),
        localized(false) {}